

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateNumber(double num)

{
  cJSON *pcVar1;
  cJSON *item;
  double num_local;
  
  pcVar1 = cJSON_New_Item(&global_hooks);
  if (pcVar1 != (cJSON *)0x0) {
    pcVar1->type = 8;
    pcVar1->valuedouble = num;
    if (num < 2147483647.0) {
      if (-2147483648.0 < num) {
        pcVar1->valueint = (int)num;
      }
      else {
        pcVar1->valueint = -0x80000000;
      }
    }
    else {
      pcVar1->valueint = 0x7fffffff;
    }
  }
  return pcVar1;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateNumber(double num)
{
    cJSON *item = cJSON_New_Item(&global_hooks);
    if(item)
    {
        item->type = cJSON_Number;
        item->valuedouble = num;

        /* use saturation in case of overflow */
        if (num >= INT_MAX)
        {
            item->valueint = INT_MAX;
        }
        else if (num <= INT_MIN)
        {
            item->valueint = INT_MIN;
        }
        else
        {
            item->valueint = (int)num;
        }
    }

    return item;
}